

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

SpectrumHandle __thiscall
pbrt::ParameterDictionary::GetOneSpectrum
          (ParameterDictionary *this,string *name,SpectrumHandle *defaultValue,
          SpectrumType spectrumType,Allocator alloc)

{
  long lVar1;
  ParsedParameter *param;
  size_t __n;
  int iVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  memory_resource *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> s;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> local_58;
  undefined8 *local_40;
  Allocator local_38;
  
  local_40 = (undefined8 *)CONCAT44(in_register_0000000c,spectrumType);
  lVar1 = *(long *)((long)&name[2].field_2 + 8);
  paVar4 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name->_M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)name->_M_string_length;
  }
  if (lVar1 != 0) {
    lVar3 = 0;
    local_38.memoryResource = in_R9;
    do {
      param = *(ParsedParameter **)((long)paVar4 + lVar3);
      __n = (param->name)._M_string_length;
      if ((__n == defaultValue[1].
                  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                  .bits) &&
         ((__n == 0 ||
          (iVar2 = bcmp((param->name)._M_dataplus._M_p,
                        (void *)(defaultValue->
                                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                                ).bits,__n), iVar2 == 0)))) {
        extractSpectrumArray
                  (&local_58,(ParameterDictionary *)name,param,(SpectrumType)alloc.memoryResource,
                   local_38);
        if (local_58.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_58.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if ((ulong)((long)local_58.
                            super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 9) {
            (this->params).alloc.memoryResource =
                 (memory_resource *)
                 ((local_58.
                   super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
                   _M_impl.super__Vector_impl_data._M_start)->
                 super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                 ).bits;
            operator_delete(local_58.
                            super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.
                                  super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.
                                  super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            return (SpectrumHandle)
                   (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                    )this;
          }
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"More than one value provided for parameter \"%s\".",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     defaultValue);
        }
        if (local_58.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      lVar3 = lVar3 + 8;
    } while (lVar1 << 3 != lVar3);
  }
  (this->params).alloc.memoryResource = (memory_resource *)*local_40;
  return (SpectrumHandle)
         (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
          )this;
}

Assistant:

SpectrumHandle ParameterDictionary::GetOneSpectrum(const std::string &name,
                                                   SpectrumHandle defaultValue,
                                                   SpectrumType spectrumType,
                                                   Allocator alloc) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name)
            continue;

        std::vector<SpectrumHandle> s = extractSpectrumArray(*p, spectrumType, alloc);
        if (!s.empty()) {
            if (s.size() > 1)
                ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                          name);
            return s[0];
        }
    }

    return defaultValue;
}